

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TablePrinter.hpp
# Opt level: O3

TablePrinter * __thiscall trl::TablePrinter::operator<<(TablePrinter *this,int input)

{
  ostream *this_00;
  long lVar1;
  long lVar2;
  pointer piVar3;
  void *pvVar4;
  int iVar5;
  TablePrinter *extraout_RAX;
  char *pcVar6;
  uint uVar7;
  
  if (this->m_columnIndex == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(this->m_outStream,"|",1);
  }
  this_00 = (ostream *)this->m_outStream;
  lVar1 = *(long *)this_00;
  lVar2 = *(long *)(lVar1 + -0x18);
  uVar7 = 0x80;
  if (this->m_flushLeft != false) {
    uVar7 = 0x20;
  }
  *(uint *)(this_00 + lVar2 + 0x18) = uVar7 | *(uint *)(this_00 + lVar2 + 0x18) & 0xffffff4f;
  piVar3 = (this->m_columnWidths).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(long)this->m_columnIndex <
      (ulong)((long)(this->m_columnWidths).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar3 >> 2)) {
    *(long *)(this_00 + *(long *)(lVar1 + -0x18) + 0x10) = (long)piVar3[this->m_columnIndex];
    std::ostream::operator<<(this_00,input);
    if (this->m_columnIndex ==
        (int)((ulong)((long)(this->m_columnTitles).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_columnTitles).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5) + -1) {
      std::__ostream_insert<char,std::char_traits<char>>(this->m_outStream,"|\n",2);
      this->m_rowIndex = this->m_rowIndex + 1;
      iVar5 = 0;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                (this->m_outStream,(this->m_columnSeparator)._M_dataplus._M_p,
                 (this->m_columnSeparator)._M_string_length);
      iVar5 = this->m_columnIndex + 1;
    }
    this->m_columnIndex = iVar5;
    return this;
  }
  pcVar6 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  if (*(long **)(pcVar6 + 0x38) != (long *)(pcVar6 + 0x48)) {
    operator_delete(*(long **)(pcVar6 + 0x38),*(long *)(pcVar6 + 0x48) + 1);
  }
  pvVar4 = *(void **)(pcVar6 + 0x20);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,*(long *)(pcVar6 + 0x30) - (long)pvVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(pcVar6 + 8));
  return extraout_RAX;
}

Assistant:

TablePrinter& operator<<(T input) {

            if constexpr(std::is_floating_point<T>::value) {
                OutputDecimalNumber<T>(input);
            }
            else {

                if (m_columnIndex == 0)
                    m_outStream << "|";

                if (m_flushLeft)
                    m_outStream << std::left;
                else
                    m_outStream << std::right;

                // Leave 3 extra space: One for negative sign, one for zero, one for decimal
                m_outStream << std::setw(m_columnWidths.at(m_columnIndex));
                m_outStream << input;

                if (m_columnIndex == GetColumnCount() - 1) {
                    m_outStream << "|\n";
                    m_rowIndex    = m_rowIndex + 1;
                    m_columnIndex = 0;
                }
                else {
                    m_outStream << m_columnSeparator;
                    ++m_columnIndex;
                }
            }
            return *this;
        }